

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

TPZManVector<TPZManVector<double,_10>,_20> * __thiscall
TPZManVector<TPZManVector<double,_10>,_20>::operator=
          (TPZManVector<TPZManVector<double,_10>,_20> *this,
          TPZManVector<TPZManVector<double,_10>,_20> *rval)

{
  double dVar1;
  TPZManVector<double,_10> *pTVar2;
  int64_t iVar3;
  TPZManVector<TPZManVector<double,_10>,_20> *in_RSI;
  TPZManVector<TPZManVector<double,_10>,_20> *in_RDI;
  int i;
  int64_t nel;
  TPZManVector<double,_10> *in_stack_ffffffffffffff30;
  TPZManVector<double,_10> *in_stack_ffffffffffffff48;
  TPZManVector<double,_10> *in_stack_ffffffffffffff50;
  int local_1c;
  
  if (in_RDI != in_RSI) {
    iVar3 = TPZVec<TPZManVector<double,_10>_>::NElements
                      (&in_RSI->super_TPZVec<TPZManVector<double,_10>_>);
    if (((in_RDI->super_TPZVec<TPZManVector<double,_10>_>).fStore != (TPZManVector<double,_10> *)0x0
        ) && ((in_RDI->super_TPZVec<TPZManVector<double,_10>_>).fStore != in_RDI->fExtAlloc)) {
      in_stack_ffffffffffffff50 = (in_RDI->super_TPZVec<TPZManVector<double,_10>_>).fStore;
      if (in_stack_ffffffffffffff50 != (TPZManVector<double,_10> *)0x0) {
        pTVar2 = in_stack_ffffffffffffff50 + -1;
        dVar1 = in_stack_ffffffffffffff50[-1].fExtAlloc[9];
        in_stack_ffffffffffffff48 = in_stack_ffffffffffffff50 + (long)dVar1;
        if (in_stack_ffffffffffffff50 != in_stack_ffffffffffffff48) {
          do {
            in_stack_ffffffffffffff30 = in_stack_ffffffffffffff48 + -1;
            TPZManVector<double,_10>::~TPZManVector(in_stack_ffffffffffffff30);
            in_stack_ffffffffffffff48 = in_stack_ffffffffffffff30;
          } while (in_stack_ffffffffffffff30 != in_stack_ffffffffffffff50);
        }
        operator_delete__(pTVar2->fExtAlloc + 9,(long)dVar1 * 0x70 + 8);
      }
      (in_RDI->super_TPZVec<TPZManVector<double,_10>_>).fStore = (TPZManVector<double,_10> *)0x0;
      (in_RDI->super_TPZVec<TPZManVector<double,_10>_>).fNAlloc = 0;
    }
    if (iVar3 < 0x15) {
      for (local_1c = 0; local_1c < iVar3; local_1c = local_1c + 1) {
        TPZManVector<double,_10>::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      }
      for (; local_1c < 0x14; local_1c = local_1c + 1) {
        TPZManVector<double,_10>::TPZManVector
                  (in_stack_ffffffffffffff50,(int64_t)in_stack_ffffffffffffff48);
        TPZManVector<double,_10>::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        TPZManVector<double,_10>::~TPZManVector(in_stack_ffffffffffffff30);
      }
      (in_RDI->super_TPZVec<TPZManVector<double,_10>_>).fStore = in_RDI->fExtAlloc;
      (in_RDI->super_TPZVec<TPZManVector<double,_10>_>).fNAlloc = 0;
      (in_RDI->super_TPZVec<TPZManVector<double,_10>_>).fNElements = iVar3;
    }
    else {
      (in_RDI->super_TPZVec<TPZManVector<double,_10>_>).fStore =
           (in_RSI->super_TPZVec<TPZManVector<double,_10>_>).fStore;
      (in_RDI->super_TPZVec<TPZManVector<double,_10>_>).fNAlloc = iVar3;
      (in_RDI->super_TPZVec<TPZManVector<double,_10>_>).fNElements = iVar3;
    }
  }
  (in_RSI->super_TPZVec<TPZManVector<double,_10>_>).fStore = (TPZManVector<double,_10> *)0x0;
  (in_RSI->super_TPZVec<TPZManVector<double,_10>_>).fNAlloc = 0;
  (in_RSI->super_TPZVec<TPZManVector<double,_10>_>).fNElements = 0;
  return in_RDI;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(TPZManVector< T, NumExtAlloc >&& rval) {
    // Checking auto assignment.
    if (this != &rval) {
      const int64_t nel = rval.NElements();
      //let us dispose of previously allocated memory
      if (this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = nullptr;
        this->fNAlloc = 0;
      }
      if (nel <= NumExtAlloc) {
        //we need to copy, unfortunately
        int i = 0;
        for(; i < nel; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNAlloc = 0;
        this->fNElements = nel;
      } else {
        this->fStore = rval.fStore;
        this->fNAlloc = nel;
        this->fNElements = nel;
      }
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
    return *this;
}